

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_lib.c
# Opt level: O0

int EVP_PKEY_CTX_set_rsa_keygen_primes(EVP_PKEY_CTX *ctx,int primes)

{
  int iVar1;
  int in_ESI;
  int *in_RDI;
  size_t primes2;
  OSSL_PARAM *p;
  OSSL_PARAM params [2];
  OSSL_PARAM *pOVar2;
  char *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  undefined1 local_a0 [40];
  long local_78;
  OSSL_PARAM *local_70;
  size_t local_68 [10];
  int local_4;
  
  local_70 = (OSSL_PARAM *)local_68;
  local_78 = (long)in_ESI;
  if ((in_RDI == (int *)0x0) || ((*in_RDI != 2 && (*in_RDI != 4)))) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30);
    ERR_set_error(6,0x93,(char *)0x0);
    local_4 = -2;
  }
  else {
    iVar1 = EVP_PKEY_CTX_is_a((EVP_PKEY_CTX *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              in_stack_ffffffffffffff30);
    if ((iVar1 == 0) &&
       (iVar1 = EVP_PKEY_CTX_is_a((EVP_PKEY_CTX *)
                                  CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                  in_stack_ffffffffffffff30), iVar1 == 0)) {
      return -1;
    }
    pOVar2 = local_70;
    local_70 = (OSSL_PARAM *)((long)local_70 + 0x28);
    OSSL_PARAM_construct_size_t(in_stack_ffffffffffffff30,(size_t *)pOVar2);
    memcpy(pOVar2,local_a0,0x28);
    pOVar2 = local_70;
    local_70 = local_70 + 1;
    OSSL_PARAM_construct_end();
    memcpy(pOVar2,&stack0xffffffffffffff38,0x28);
    local_4 = evp_pkey_ctx_set_params_strict
                        ((EVP_PKEY_CTX *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),pOVar2);
  }
  return local_4;
}

Assistant:

int EVP_PKEY_CTX_set_rsa_keygen_primes(EVP_PKEY_CTX *ctx, int primes)
{
    OSSL_PARAM params[2], *p = params;
    size_t primes2 = primes;

    if (ctx == NULL || !EVP_PKEY_CTX_IS_GEN_OP(ctx)) {
        ERR_raise(ERR_LIB_EVP, EVP_R_COMMAND_NOT_SUPPORTED);
        /* Uses the same return values as EVP_PKEY_CTX_ctrl */
        return -2;
    }

    /* If key type not RSA return error */
    if (!EVP_PKEY_CTX_is_a(ctx, "RSA")
        && !EVP_PKEY_CTX_is_a(ctx, "RSA-PSS"))
        return -1;

    *p++ = OSSL_PARAM_construct_size_t(OSSL_PKEY_PARAM_RSA_PRIMES, &primes2);
    *p++ = OSSL_PARAM_construct_end();

    return evp_pkey_ctx_set_params_strict(ctx, params);
}